

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

void __thiscall QFileSystemMetaData::fillFromStatxBuf(QFileSystemMetaData *this,statx *statxBuffer)

{
  long lVar1;
  MetaDataFlags other;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> other_00;
  qint64 qVar2;
  uint *in_RSI;
  QFlags<QFileSystemMetaData::MetaDataFlag> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  bool birthMask;
  MetaDataFlags flags;
  undefined8 in_stack_ffffffffffffffc8;
  mode_t in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = flagsFromStMode(in_stack_ffffffffffffffd8,(quint64)in_RDI);
  QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
            (in_RDI + 1,
             (QFlags<QFileSystemMetaData::MetaDataFlag>)
             other.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i);
  other_00.i = (Int)QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                              (in_RDI,(MetaDataFlag)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
            (in_RDI,(QFlags<QFileSystemMetaData::MetaDataFlag>)other_00.i);
  if (in_RSI[4] == 0) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RDI + 1,WasDeletedAttribute);
  }
  *(undefined8 *)(in_RDI + 2) = *(undefined8 *)(in_RSI + 10);
  qVar2 = anon_unknown.dwarf_2dc537::GetFileTimes::timespecToMSecs<statx_timestamp>
                    ((statx_timestamp *)CONCAT44(other_00.i,in_stack_ffffffffffffffd8));
  *(qint64 *)(in_RDI + 4) = qVar2;
  qVar2 = anon_unknown.dwarf_2dc537::GetFileTimes::timespecToMSecs<statx_timestamp>
                    ((statx_timestamp *)CONCAT44(other_00.i,in_stack_ffffffffffffffd8));
  *(qint64 *)(in_RDI + 8) = qVar2;
  qVar2 = anon_unknown.dwarf_2dc537::GetFileTimes::timespecToMSecs<statx_timestamp>
                    ((statx_timestamp *)CONCAT44(other_00.i,in_stack_ffffffffffffffd8));
  *(qint64 *)(in_RDI + 10) = qVar2;
  bVar3 = (*in_RSI & 0x800) != 0;
  if (bVar3) {
    qVar2 = anon_unknown.dwarf_2dc537::GetFileTimes::timespecToMSecs<statx_timestamp>
                      ((statx_timestamp *)
                       CONCAT44(other_00.i,CONCAT13(bVar3,(int3)in_stack_ffffffffffffffd8)));
  }
  else {
    qVar2 = 0;
  }
  *(qint64 *)(in_RDI + 6) = qVar2;
  in_RDI[0xc].super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = in_RSI[5];
  in_RDI[0xd].super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = in_RSI[6];
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QFileSystemMetaData::fillFromStatxBuf(const struct statx &statxBuffer)
{
    // Permissions
    MetaDataFlags flags = flagsFromStMode(statxBuffer.stx_mode, statxBuffer.stx_attributes);
    entryFlags |= flags;
    knownFlagsMask |= flags | PosixStatFlags;

    // Attributes
    if (statxBuffer.stx_nlink == 0)
        entryFlags |= QFileSystemMetaData::WasDeletedAttribute;
    size_ = qint64(statxBuffer.stx_size);

    // Times
    using namespace GetFileTimes;
    accessTime_ = timespecToMSecs(statxBuffer.stx_atime);
    metadataChangeTime_ = timespecToMSecs(statxBuffer.stx_ctime);
    modificationTime_ = timespecToMSecs(statxBuffer.stx_mtime);
    const bool birthMask = statxBuffer.stx_mask & STATX_BTIME;
    birthTime_ = birthMask ? timespecToMSecs(statxBuffer.stx_btime) : 0;

    userId_ = statxBuffer.stx_uid;
    groupId_ = statxBuffer.stx_gid;
}